

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_io.c
# Opt level: O2

int io_file_close(lua_State *L,IOFileUD *iof)

{
  TValue *pTVar1;
  uint uVar2;
  int iVar3;
  
  uVar2 = iof->type & 3;
  if (uVar2 == 1) {
    iVar3 = pclose((FILE *)iof->fp);
    iof->fp = (FILE *)0x0;
    iVar3 = luaL_execresult(L,iVar3);
    return iVar3;
  }
  if (uVar2 == 0) {
    iVar3 = fclose((FILE *)iof->fp);
    iof->fp = (FILE *)0x0;
    iVar3 = luaL_fileresult(L,(uint)(iVar3 == 0),(char *)0x0);
    return iVar3;
  }
  pTVar1 = L->top;
  L->top = pTVar1 + 1;
  (pTVar1->field_2).it = 0xffffffff;
  lua_pushlstring(L,"cannot close standard file",0x1a);
  return 2;
}

Assistant:

static int io_file_close(lua_State *L, IOFileUD *iof)
{
  int ok;
  if ((iof->type & IOFILE_TYPE_MASK) == IOFILE_TYPE_FILE) {
    ok = (fclose(iof->fp) == 0);
  } else if ((iof->type & IOFILE_TYPE_MASK) == IOFILE_TYPE_PIPE) {
    int stat = -1;
#if LJ_TARGET_POSIX
    stat = pclose(iof->fp);
#elif LJ_TARGET_WINDOWS
    stat = _pclose(iof->fp);
#else
    lua_assert(0);
    return 0;
#endif
#if LJ_52
    iof->fp = NULL;
    return luaL_execresult(L, stat);
#else
    ok = (stat != -1);
#endif
  } else {
    lua_assert((iof->type & IOFILE_TYPE_MASK) == IOFILE_TYPE_STDF);
    setnilV(L->top++);
    lua_pushliteral(L, "cannot close standard file");
    return 2;
  }
  iof->fp = NULL;
  return luaL_fileresult(L, ok, NULL);
}